

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O0

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Regular>::Connect
               (BenchmarkContext *context,int64_t numSlots)

{
  size_type __n;
  Storage<wigwag::token> *this;
  function<void_()> *handler_00;
  anon_class_8_1_54a39803 local_120;
  allocator local_111;
  string local_110;
  function<void_()> local_f0;
  token local_d0;
  long local_c8;
  int64_t i;
  int64_t j;
  string local_b0 [32];
  undefined1 local_90 [8];
  IOperationProfilerPtr op;
  StorageArray<wigwag::token> c;
  allocator<wigwag::signal<void_()>_> local_59;
  undefined1 local_58 [8];
  vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_> s;
  HandlerType handler;
  int64_t n;
  int64_t numSlots_local;
  BenchmarkContext *context_local;
  
  __n = BenchmarkContext::GetIterationsCount(context);
  descriptors::signal::wigwag::Regular::MakeHandler();
  std::allocator<wigwag::signal<void_()>_>::allocator(&local_59);
  std::vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>::vector
            ((vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_> *)local_58,
             __n,&local_59);
  std::allocator<wigwag::signal<void_()>_>::~allocator(&local_59);
  StorageArray<wigwag::token>::StorageArray
            ((StorageArray<wigwag::token> *)
             &op.super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,numSlots * __n);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"connect",(allocator *)((long)&j + 7));
  (*context->_vptr_BenchmarkContext[3])(local_90,context,local_b0,numSlots * __n);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&j + 7));
  for (i = 0; i < (long)__n; i = i + 1) {
    for (local_c8 = 0; local_c8 < numSlots; local_c8 = local_c8 + 1) {
      this = StorageArray<wigwag::token>::operator[]
                       ((StorageArray<wigwag::token> *)
                        &op.
                         super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,local_c8 + i * numSlots);
      handler_00 = (function<void_()> *)
                   std::vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>::
                   operator[]((vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>
                               *)local_58,i);
      std::function<void_()>::function
                (&local_f0,
                 (function<void_()> *)
                 &s.
                  super__Vector_base<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      wigwag::signal<void()>::connect<std::function<void()>>
                ((signal<void()> *)&local_d0,handler_00,(handler_attributes)&local_f0);
      Storage<wigwag::token>::Construct<wigwag::token>
                ((Storage<wigwag::token> *)&this->_obj,&local_d0);
      wigwag::token::~token(&local_d0);
      std::function<void_()>::~function(&local_f0);
    }
  }
  std::shared_ptr<benchmarks::IOperationProfiler>::~shared_ptr
            ((shared_ptr<benchmarks::IOperationProfiler> *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"disconnect",&local_111);
  local_120.c = (StorageArray<wigwag::token> *)
                &op.super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Regular>::Connect(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (context,&local_110,numSlots * __n,&local_120);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  StorageArray<wigwag::token>::~StorageArray
            ((StorageArray<wigwag::token> *)
             &op.super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>::~vector
            ((vector<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_> *)local_58)
  ;
  std::function<void_()>::~function
            ((function<void_()> *)
             &s.
              super__Vector_base<wigwag::signal<void_()>,_std::allocator<wigwag::signal<void_()>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

static void Connect(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            std::vector<SignalType> s(n);
            StorageArray<ConnectionType> c(numSlots * n);

            {
                auto op = context.Profile("connect", numSlots * n);
                for (int64_t j = 0; j < n; ++j)
                    for (int64_t i = 0; i < numSlots; ++i)
                        c[i + j * numSlots].Construct(s[j].connect(handler));
            }

            context.Profile("disconnect", numSlots * n, [&]{ c.Destruct(); });
        }